

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void function(FunctionType type)

{
  int iVar1;
  uint8_t uVar2;
  _Bool _Var3;
  ObjFunction *pOVar4;
  int i;
  long lVar5;
  Compiler compiler;
  
  initCompiler(&compiler,type);
  current->scopeDepth = current->scopeDepth + 1;
  consume(TOKEN_LEFT_PAREN,"Expect \'(\' after function name.");
  if (parser.current.type != TOKEN_RIGHT_PAREN) {
    do {
      iVar1 = current->function->arity;
      current->function->arity = iVar1 + 1;
      if (0xfe < iVar1) {
        errorAtCurrent("Cannot have more than 255 parameters.");
      }
      uVar2 = parseVariable("Expect parameter name.");
      defineVariable(uVar2);
      _Var3 = match(TOKEN_COMMA);
    } while (_Var3);
  }
  consume(TOKEN_RIGHT_PAREN,"Expect \')\' after parameters.");
  consume(TOKEN_LEFT_BRACE,"Expect \'{\' before function body.");
  block();
  pOVar4 = endCompiler();
  uVar2 = makeConstant((ulong)pOVar4 | 0xfffc000000000000);
  emitBytes('\x1f',uVar2);
  for (lVar5 = 0; lVar5 < pOVar4->upvalueCount; lVar5 = lVar5 + 1) {
    emitByte(compiler.upvalues[lVar5].isLocal);
    emitByte(compiler.upvalues[lVar5].index);
  }
  return;
}

Assistant:

static void function(FunctionType type) {
    Compiler compiler;
    initCompiler(&compiler, type);
    beginScope();

    // Compile the parameter list.
    consume(TOKEN_LEFT_PAREN, "Expect '(' after function name.");

    //Parameter
    if (!check(TOKEN_RIGHT_PAREN)) {
        do {
            current->function->arity++;
            if (current->function->arity > PARAMS_MAX) {
                errorAtCurrent("Cannot have more than 255 parameters.");
            }

            uint8_t paramConstant = parseVariable("Expect parameter name.");
            defineVariable(paramConstant);
        } while (match(TOKEN_COMMA));
    }

    consume(TOKEN_RIGHT_PAREN, "Expect ')' after parameters.");

    // The body.
    consume(TOKEN_LEFT_BRACE, "Expect '{' before function body.");
    block();

    // Create the function object.
    ObjFunction* function = endCompiler();
    emitBytes(OP_CLOSURE, makeConstant(OBJ_VAL(function)));

    /*
     * if the first byte is one, it captures a local variable in the enclosing function.
     * If zero, it captures one of the function’s UpValues
     */
    for (int i = 0; i < function->upvalueCount; i++) {
        emitByte(compiler.upvalues[i].isLocal ? 1 : 0);
        emitByte(compiler.upvalues[i].index);
    }
}